

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O1

uint8_t * DecodeIntoRGBABuffer
                    (WEBP_CSP_MODE colorspace,uint8_t *data,size_t data_size,uint8_t *rgba,
                    int stride,size_t size)

{
  int iVar1;
  VP8StatusCode VVar2;
  uint8_t *puVar3;
  WebPDecBuffer buf;
  WebPDecParams params;
  WebPDecBuffer local_120;
  WebPDecParams local_a8;
  
  if (rgba == (uint8_t *)0x0) {
    return (uint8_t *)0x0;
  }
  iVar1 = WebPInitDecBufferInternal(&local_120,0x210);
  if (iVar1 == 0) {
    puVar3 = (uint8_t *)0x0;
  }
  else {
    local_a8.tmp_y = (uint8_t *)0x0;
    local_a8.emit_alpha = (OutputAlphaFunc)0x0;
    local_a8.emit_alpha_row = (OutputRowFunc)0x0;
    local_a8.memory = (void *)0x0;
    local_a8.emit = (OutputFunc)0x0;
    local_a8.scaler_v = (WebPRescaler *)0x0;
    local_a8.scaler_a = (WebPRescaler *)0x0;
    local_a8.scaler_y = (WebPRescaler *)0x0;
    local_a8.scaler_u = (WebPRescaler *)0x0;
    local_a8.last_y = 0;
    local_a8._36_4_ = 0;
    local_a8.options = (WebPDecoderOptions *)0x0;
    local_a8.tmp_u = (uint8_t *)0x0;
    local_a8.tmp_v = (uint8_t *)0x0;
    local_a8.output = &local_120;
    local_120.is_external_memory = 1;
    local_120.colorspace = colorspace;
    local_120.u.RGBA.rgba = rgba;
    local_120.u.RGBA.stride = stride;
    local_120.u.RGBA.size = size;
    VVar2 = DecodeInto(data,data_size,&local_a8);
    puVar3 = (uint8_t *)0x0;
    if (VVar2 == VP8_STATUS_OK) {
      puVar3 = rgba;
    }
  }
  return puVar3;
}

Assistant:

WEBP_NODISCARD static uint8_t* DecodeIntoRGBABuffer(WEBP_CSP_MODE colorspace,
                                                    const uint8_t* const data,
                                                    size_t data_size,
                                                    uint8_t* const rgba,
                                                    int stride, size_t size) {
  WebPDecParams params;
  WebPDecBuffer buf;
  if (rgba == NULL || !WebPInitDecBuffer(&buf)) {
    return NULL;
  }
  WebPResetDecParams(&params);
  params.output = &buf;
  buf.colorspace    = colorspace;
  buf.u.RGBA.rgba   = rgba;
  buf.u.RGBA.stride = stride;
  buf.u.RGBA.size   = size;
  buf.is_external_memory = 1;
  if (DecodeInto(data, data_size, &params) != VP8_STATUS_OK) {
    return NULL;
  }
  return rgba;
}